

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O2

int dfsplain_r(Abc_Obj_t *pObj,Abc_Obj_t *pPred)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Flow_Data_t *pFVar4;
  Abc_Obj_t *pAVar5;
  ulong uVar6;
  ushort uVar7;
  long lVar8;
  
  uVar1 = *(uint *)&pObj->field_0x14 & 0xf;
  if (uVar1 == 8) goto LAB_0040c443;
  if (pManMR->fIsForward == 0) {
    pFVar4 = pManMR->pDataArray;
    uVar6 = (ulong)(uint)pObj->Id;
    uVar7 = *(ushort *)(pFVar4 + uVar6);
  }
  else {
    if (uVar1 == 3) {
LAB_0040c443:
      if (pPred != (Abc_Obj_t *)0x0) {
        return 1;
      }
      __assert_fail("pPred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretFlow.c"
                    ,0x271,"int dfsplain_r(Abc_Obj_t *, Abc_Obj_t *)");
    }
    pFVar4 = pManMR->pDataArray;
    uVar6 = (ulong)(uint)pObj->Id;
    uVar7 = (ushort)*(uint *)(pFVar4 + uVar6);
    if ((pManMR->constraintMask & *(uint *)(pFVar4 + uVar6) & 0x90) != 0) goto LAB_0040c443;
  }
  *(ushort *)(pFVar4 + uVar6) = uVar7 | 2;
  pFVar4 = pManMR->pDataArray;
  if ((undefined1  [24])((undefined1  [24])pFVar4[(uint)pObj->Id] & (undefined1  [24])0x4) ==
      (undefined1  [24])0x0) {
    if (((undefined1  [24])((undefined1  [24])pFVar4[(uint)pObj->Id] & (undefined1  [24])0x1) !=
         (undefined1  [24])0x0) || (iVar2 = dfsplain_e(pObj,pObj), iVar2 == 0)) {
LAB_0040c4f6:
      if (pManMR->fIsForward != 0) {
        for (lVar8 = 0; lVar8 < (pObj->vFanins).nSize; lVar8 = lVar8 + 1) {
          pAVar5 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar8]];
          if ((((undefined1  [24])
                ((undefined1  [24])pManMR->pDataArray[(uint)pAVar5->Id] & (undefined1  [24])0x2) ==
                (undefined1  [24])0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) != 8)) &&
             (iVar2 = dfsplain_r(pAVar5,pPred), iVar2 != 0)) {
            return 1;
          }
        }
        if (pManMR->maxDelay != 0) {
          iVar2 = 0;
          while( true ) {
            if (pManMR->vTimeEdges[(uint)pObj->Id].nSize <= iVar2) {
              return 0;
            }
            pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(pManMR->vTimeEdges + (uint)pObj->Id,iVar2);
            if (((undefined1  [24])
                 ((undefined1  [24])pManMR->pDataArray[(uint)pAVar5->Id] & (undefined1  [24])0x2) ==
                 (undefined1  [24])0x0) && (iVar3 = dfsplain_r(pAVar5,pPred), iVar3 != 0)) break;
            iVar2 = iVar2 + 1;
          }
          return 1;
        }
      }
      return 0;
    }
    *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
         *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) | 4;
  }
  else {
    pAVar5 = pFVar4[(uint)pObj->Id].field_1.pred;
    if (((pAVar5 == (Abc_Obj_t *)0x0) ||
        ((undefined1  [24])((undefined1  [24])pFVar4[(uint)pAVar5->Id] & (undefined1  [24])0x1) !=
         (undefined1  [24])0x0)) || (iVar2 = dfsplain_e(pAVar5,pAVar5), iVar2 == 0))
    goto LAB_0040c4f6;
  }
  FSETPRED(pObj,pPred);
  return 1;
}

Assistant:

int dfsplain_r( Abc_Obj_t *pObj, Abc_Obj_t *pPred ) {
  int i;
  Abc_Obj_t *pNext, *pOldPred;

  // have we reached the sink?
  if (Abc_ObjIsLatch(pObj) || 
      (pManMR->fIsForward && Abc_ObjIsPo(pObj)) || 
      (pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
    assert(pPred);
    return 1;
  }

  FSET(pObj, VISITED_R);

  // printf(" %dr\n", Abc_ObjId(pObj));

  if (FTEST(pObj, FLOW)) {

    pOldPred = FGETPRED(pObj);
    if (pOldPred && 
        !FTEST(pOldPred, VISITED_E) &&
        dfsplain_e(pOldPred, pOldPred)) {

      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("fr");
#endif
      goto found;
    }
    
  } else {

    if (!FTEST(pObj, VISITED_E) &&
        dfsplain_e(pObj, pObj)) {

      FSET(pObj, FLOW);
      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("f");
#endif
      goto found;
    }
  }
 
  // 2. follow reverse edges
  if (pManMR->fIsForward) { // forward retiming only
    Abc_ObjForEachFanin( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          !Abc_ObjIsLatch(pNext) &&
          dfsplain_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("i");
#endif
        goto found;
      }
    }
  
  // 3. timing edges (forward only)
#if !defined(IGNORE_TIMING)
    if (pManMR->maxDelay) 
      Vec_PtrForEachEntry(Abc_Obj_t*, FTIMEEDGES(pObj), pNext, i) {
        if (!FTEST(pNext, VISITED_R) &&
            dfsplain_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
          printf("o");
#endif
          goto found;
        }
      }
#endif
  }
  
  return 0;

 found:
#ifdef DEBUG_PRINT_FLOWS
  printf("%d ", Abc_ObjId(pObj));
#endif
  return 1;
}